

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.h
# Opt level: O2

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::
bindProcessName<Catch::ConfigData,std::__cxx11::string>
          (CommandLine<Catch::ConfigData> *this,
          offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          field)

{
  BoundArgFunction<Catch::ConfigData> local_20;
  
  local_20.functionObj = (IArgFunction<Catch::ConfigData> *)operator_new(0x10);
  (local_20.functionObj)->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_0018d1b8;
  local_20.functionObj[1]._vptr_IArgFunction = (_func_int **)field;
  Detail::BoundArgFunction<Catch::ConfigData>::operator=(&this->m_boundProcessName,&local_20);
  if (local_20.functionObj != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*(local_20.functionObj)->_vptr_IArgFunction[1])();
  }
  return;
}

Assistant:

void bindProcessName( M C::* field ) {
            m_boundProcessName = new Detail::BoundDataMember<C,M>( field );
        }